

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareDwa.cpp
# Opt level: O2

void compareDwa(int width,int height,Array2D<Imf_3_2::Rgba> *src,Array2D<Imf_3_2::Rgba> *test,
               RgbaChannels channels)

{
  float fVar1;
  uint __line;
  long lVar2;
  long lVar3;
  half hVar4;
  half hVar5;
  Rgba *pRVar6;
  half *phVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  half *phVar11;
  char *__assertion;
  ulong uVar12;
  float fVar13;
  
  uVar8 = 0;
  uVar10 = (ulong)(uint)width;
  if (width < 1) {
    uVar10 = uVar8;
  }
  uVar9 = (ulong)(uint)height;
  if (height < 1) {
    uVar9 = uVar8;
  }
  while( true ) {
    if (uVar8 == uVar9) {
      if ((channels & WRITE_A) != 0) {
        phVar7 = &src->_data->a;
        phVar11 = &test->_data->a;
        for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
          uVar12 = 0;
          while (uVar10 != uVar12) {
            lVar2 = uVar12 * 4;
            lVar3 = uVar12 * 4;
            uVar12 = uVar12 + 1;
            if ((_imath_half_to_float_table[phVar7[lVar2]._h] !=
                 _imath_half_to_float_table[phVar11[lVar3]._h]) ||
               (NAN(_imath_half_to_float_table[phVar7[lVar2]._h]) ||
                NAN(_imath_half_to_float_table[phVar11[lVar3]._h]))) {
              __assertion = "src[y][x].a == test[y][x].a";
              __line = 0x75;
              goto LAB_0011dd95;
            }
          }
          phVar7 = phVar7 + src->_sizeY * 4;
          phVar11 = phVar11 + test->_sizeY * 4;
        }
      }
      return;
    }
    if (uVar10 != 0) break;
    uVar8 = uVar8 + 1;
  }
  if ((channels & WRITE_R) == 0) goto LAB_0011db7c;
  hVar4 = toNonlinear(src->_data[src->_sizeY * uVar8].r._h);
  pRVar6 = test->_data + test->_sizeY * uVar8;
  do {
    hVar5 = toNonlinear((pRVar6->r)._h);
    if (hVar4._h == 0) {
      if ((*_imath_half_to_float_table == _imath_half_to_float_table[hVar5._h]) &&
         (!NAN(*_imath_half_to_float_table) && !NAN(_imath_half_to_float_table[hVar5._h]))) {
        __assertion = "srcNonlin != testNonlin";
        __line = 0x66;
        goto LAB_0011dd95;
      }
    }
    else {
      fVar1 = _imath_half_to_float_table[hVar4._h];
      if (0.1 <= ABS(fVar1)) {
        fVar13 = ABS((fVar1 - _imath_half_to_float_table[hVar5._h]) / fVar1);
        if (0.25 <= ABS(fVar1)) {
          if (0.1 <= fVar13) {
            __assertion = "relError < .1";
            __line = 0x61;
            goto LAB_0011dd95;
          }
        }
        else if (0.25 <= fVar13) {
          __assertion = "relError < .25";
          __line = 0x5e;
LAB_0011dd95:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareDwa.cpp"
                        ,__line,
                        "void compareDwa(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
    }
LAB_0011db7c:
    do {
    } while ((channels & WRITE_G) == 0);
    hVar4 = toNonlinear(src->_data[src->_sizeY * uVar8].g._h);
    pRVar6 = (Rgba *)&test->_data[test->_sizeY * uVar8].g;
  } while( true );
}

Assistant:

void
compareDwa (
    int                  width,
    int                  height,
    const Array2D<Rgba>& src,
    const Array2D<Rgba>& test,
    RgbaChannels         channels)
{
    half  srcNonlin, testNonlin;
    float relError;

    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {

            for (int comp = 0; comp < 3; ++comp)
            {
                switch (comp)
                {
                    case 0:
                        if (!(channels & WRITE_R)) continue;

                        srcNonlin  = toNonlinear (src[y][x].r);
                        testNonlin = toNonlinear (test[y][x].r);
                        break;
                    case 1:
                        if (!(channels & WRITE_G)) continue;

                        srcNonlin  = toNonlinear (src[y][x].g);
                        testNonlin = toNonlinear (test[y][x].g);
                        break;
                    case 2:
                        if (!(channels & WRITE_B)) continue;

                        srcNonlin  = toNonlinear (src[y][x].b);
                        testNonlin = toNonlinear (test[y][x].b);
                        break;
                }

                //
                // Try to compare with relative error. This breaks down
                // for small numbers, which could be quantiezed to 0
                // giving 100% error.
                //
                if (srcNonlin.bits () != 0x00)
                {

                    relError = fabs ((float) srcNonlin - (float) testNonlin) /
                               fabs ((float) srcNonlin);

                    if (fabs (srcNonlin) < .1) continue;

                    if (fabs (srcNonlin) < .25) { assert (relError < .25); }
                    else
                    {
                        assert (relError < .1);
                    }
                }
                else
                {
                    assert (srcNonlin != testNonlin);
                }
            }
        }
    }

    //
    // Test alpha, if necessary
    //
    if (channels & WRITE_A)
    {
        for (int y = 0; y < height; ++y)
        {
            for (int x = 0; x < width; ++x)
            {
                assert (src[y][x].a == test[y][x].a);
            }
        }
    }
}